

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O3

_Bool has_property(artifact *art,object *obj,char *prop_name)

{
  byte bVar1;
  _Bool *p_Var2;
  _Bool _Var3;
  short sVar4;
  int iVar5;
  obj_property *poVar6;
  object_kind *poVar7;
  char *pcVar8;
  int16_t *piVar9;
  short sVar10;
  bitflag *flags;
  element_info *peVar11;
  _Bool **pp_Var12;
  int16_t *piVar13;
  ulong uVar14;
  char **ppcVar15;
  char *pcVar16;
  
  poVar6 = lookup_obj_property_name(prop_name);
  if (poVar6 == (obj_property *)0x0) {
    __assert_fail("prop",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,100,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  if (art == (artifact *)0x0 && obj == (object *)0x0) {
    __assert_fail("art || ((art == NULL) && obj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,0x65,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  switch(poVar6->type) {
  case L'\x01':
  case L'\x02':
    piVar9 = obj->modifiers;
    if (art != (artifact *)0x0) {
      piVar9 = art->modifiers;
    }
    if (piVar9[poVar6->index] != 0) {
      return true;
    }
    break;
  case L'\x03':
    flags = obj->flags;
    if (art != (artifact *)0x0) {
      flags = art->flags;
    }
    _Var3 = flag_has_dbg(flags,6,poVar6->index,"flags","prop->index");
    if (_Var3) {
      return true;
    }
    break;
  case L'\x04':
    peVar11 = obj->el_info;
    if (art != (artifact *)0x0) {
      peVar11 = art->el_info;
    }
    if (peVar11[poVar6->index].res_level != 100) {
      return true;
    }
    break;
  case L'\x05':
    peVar11 = obj->el_info;
    if (art != (artifact *)0x0) {
      peVar11 = art->el_info;
    }
    if ((peVar11[poVar6->index].flags & 2) != 0) {
      return true;
    }
    break;
  case L'\x06':
    pp_Var12 = &obj->brands;
    if (art != (artifact *)0x0) {
      pp_Var12 = &art->brands;
    }
    p_Var2 = *pp_Var12;
    if ((p_Var2 != (_Bool *)0x0) && (bVar1 = z_info->brand_max, 1 < (ulong)bVar1)) {
      pcVar16 = poVar6->name;
      ppcVar15 = &brands[1].name;
      uVar14 = 1;
      do {
        pcVar8 = strstr(pcVar16,*ppcVar15);
        if ((pcVar8 != (char *)0x0) && (p_Var2[uVar14] != false)) {
          return true;
        }
        uVar14 = uVar14 + 1;
        ppcVar15 = ppcVar15 + 6;
      } while (bVar1 != uVar14);
    }
    break;
  case L'\a':
    pp_Var12 = &obj->slays;
    if (art != (artifact *)0x0) {
      pp_Var12 = &art->slays;
    }
    p_Var2 = *pp_Var12;
    if ((p_Var2 != (_Bool *)0x0) && (bVar1 = z_info->slay_max, 1 < (ulong)bVar1)) {
      pcVar16 = poVar6->name;
      ppcVar15 = &slays[1].name;
      uVar14 = 1;
      do {
        pcVar8 = strstr(pcVar16,*ppcVar15);
        if ((pcVar8 != (char *)0x0) && (p_Var2[uVar14] != false)) {
          return true;
        }
        uVar14 = uVar14 + 1;
        ppcVar15 = ppcVar15 + 7;
      } while (bVar1 != uVar14);
    }
    break;
  case L'\b':
    if (art == (artifact *)0x0) {
      poVar7 = lookup_kind((uint)obj->tval,(uint)obj->sval);
      pcVar16 = poVar6->name;
      iVar5 = strcmp(pcVar16,"enhanced dice");
      if (iVar5 != 0) goto LAB_00193fff;
      if (poVar7->dd < (int)(uint)obj->dd) {
        return true;
      }
      bVar1 = obj->ds;
    }
    else {
      poVar7 = lookup_kind(art->tval,art->sval);
      pcVar16 = poVar6->name;
      iVar5 = strcmp(pcVar16,"enhanced dice");
      if (iVar5 != 0) {
LAB_00193fff:
        iVar5 = strcmp(pcVar16,"extra armor");
        if (iVar5 == 0) {
          piVar9 = &obj->ac;
          if (art != (artifact *)0x0) {
            piVar9 = &art->ac;
          }
          sVar4 = *piVar9;
          sVar10 = (short)poVar7->ac;
        }
        else {
          iVar5 = strcmp(pcVar16,"armor bonus");
          if (iVar5 == 0) {
            piVar9 = &art->to_a;
            piVar13 = &obj->to_a;
          }
          else {
            iVar5 = strcmp(pcVar16,"skill bonus");
            if (iVar5 != 0) {
              iVar5 = strcmp(pcVar16,"deadliness bonus");
              sVar10 = 0;
              if (iVar5 == 0) {
                piVar9 = &obj->to_d;
                if (art != (artifact *)0x0) {
                  piVar9 = &art->to_d;
                }
                sVar4 = *piVar9;
              }
              else {
                sVar4 = 0;
                sVar10 = 0;
              }
              goto LAB_001940a7;
            }
            piVar9 = &art->to_h;
            piVar13 = &obj->to_h;
          }
          if (art != (artifact *)0x0) {
            piVar13 = piVar9;
          }
          sVar4 = *piVar13;
          sVar10 = 0;
        }
LAB_001940a7:
        if (sVar10 == sVar4) {
          return false;
        }
        return true;
      }
      if (poVar7->dd < (int)(uint)art->dd) {
        return true;
      }
      bVar1 = art->ds;
    }
    if (poVar7->ds < (int)(uint)bVar1) {
      return true;
    }
    break;
  default:
    msg("error -- object property not recognized.");
  }
  return false;
}

Assistant:

static bool has_property(struct artifact *art, struct object *obj,
						 const char *prop_name)
{
	struct obj_property *prop = lookup_obj_property_name(prop_name);
	assert(prop);
	assert(art || ((art == NULL) && obj));

	switch (prop->type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
		{
			int16_t *modifiers = art ? art->modifiers : obj->modifiers;
			if (modifiers[prop->index] != 0) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_FLAG:
		{
			bitflag *flags = art ? art->flags : obj->flags;
			if (of_has(flags, prop->index)) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_ELEMENT:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].res_level != RES_LEVEL_BASE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_IGNORE:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].flags & EL_INFO_IGNORE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_BRAND:
		{
			bool *b = art ? art->brands : obj->brands;
			int pick;

			/* See if there are any brands, if so get the correct one */
			if (!b) return false;
			for (pick = 1; pick < z_info->brand_max; pick++) {
				if (strstr(prop->name, brands[pick].name) && b[pick])
					break;
			}

			if (pick < z_info->brand_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_SLAY:
		{
			bool *s = art ? art->slays : obj->slays;
			int pick;

			/* See if there are any slays, if so get the correct one */
			if (!s) return false;
			for (pick = 1; pick < z_info->slay_max; pick++) {
				if (strstr(prop->name, slays[pick].name) && s[pick])
					break;
			}

			if (pick < z_info->slay_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_COMBAT:
		{
			/* Get the object kind to compare */
			struct object_kind *kind = art ? lookup_kind(art->tval, art->sval)
				: lookup_kind(obj->tval, obj->sval);

			/* Enhanced dice require special calculations */
			if (streq(prop->name, "enhanced dice")) {
				if (art) {
					if ((art->dd > kind->dd) || (art->ds > kind->ds)) {
						return true;
					}
				} else if ((obj->dd > kind->dd) || (obj->ds > kind->ds)) {
					return true;
				}
			} else {
				/* Various things get checked to here */
				int16_t bonus = 0, standard = 0;
				if (streq(prop->name, "extra armor")) {
					bonus = art ? art->ac : obj->ac;
					standard = kind->ac;
				} else if (streq(prop->name, "armor bonus")) {
					bonus = art ? art->to_a : obj->to_a;
				} else if (streq(prop->name, "skill bonus")) {
					bonus = art ? art->to_h : obj->to_h;
				} else if (streq(prop->name, "deadliness bonus")) {
					bonus = art ? art->to_d : obj->to_d;
				}
				if (bonus != standard) {
					return true;
				}
			}
			break;
		}

		default: msg("error -- object property not recognized."); break;
	}

	return false;
}